

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  file_ptr *pfVar1;
  pointer first;
  bool bVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  size_t sVar5;
  ostream *poVar6;
  int *piVar7;
  char *__s;
  int iVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  parser<pstore::exchange::import_ns::callbacks> parser;
  database db;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_258;
  long *local_238;
  long local_230;
  long local_228 [2];
  long *local_218;
  long local_210;
  long local_208 [2];
  parser<pstore::exchange::import_ns::callbacks> local_1f8;
  database local_150;
  
  pfVar1 = &local_150.storage_.file_;
  local_150._vptr_database = (_func_int **)pfVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"pstore import utility\n","")
  ;
  bVar2 = pstore::command_line::details::
          parse_command_line_options<char*const*,std::ostream,std::ostream>
                    (argv,argv + argc,(string *)&local_150,
                     (basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                     (basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  if (!bVar2) {
    exit(1);
  }
  if ((file_ptr *)local_150._vptr_database != pfVar1) {
    operator_delete(local_150._vptr_database,
                    (ulong)((long)&(local_150.storage_.file_.
                                    super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_file_base + 1));
  }
  bVar2 = pstore::file::exists((string *)((anonymous_namespace)::db_path_abi_cxx11_ + 0x88));
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: the import database must not be an existing file.",0x38
              );
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
    std::ostream::put('\0');
    iVar8 = 1;
    std::ostream::flush();
  }
  else {
    pstore::database::database
              (&local_150,(string *)((anonymous_namespace)::db_path_abi_cxx11_ + 0x88),writable,true
              );
    uVar3 = pstore::command_line::option::get_num_occurrences
                      ((option *)(anonymous_namespace)::json_source_abi_cxx11_);
    __stream = _stdin;
    if (uVar3 != 0) {
      __stream = fopen((char *)(anonymous_namespace)::json_source_abi_cxx11_._136_8_,"r");
    }
    if (__stream == (FILE *)0x0) {
      piVar7 = __errno_location();
      iVar8 = *piVar7;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: could not open \"",0x17);
      (anonymous_namespace)::input_name_abi_cxx11_();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,
                          (char *)local_1f8.singletons_._M_t.
                                  super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                                  .
                                  super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                                  ._M_head_impl,
                          (long)local_1f8.stack_.c.
                                super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_map);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\": ",3);
      __s = strerror(iVar8);
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
      }
      else {
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (local_1f8.singletons_._M_t.
          super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
          .
          super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>,_true,_true>
           )((long)&local_1f8.stack_.c.
                    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                    ._M_impl.super__Deque_impl_data + 8U)) {
        operator_delete((void *)local_1f8.singletons_._M_t.
                                super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                                .
                                super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                                ._M_head_impl,
                        local_1f8.stack_.c.
                        super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_map_size + 1);
      }
      iVar8 = 1;
    }
    else {
      pstore::exchange::import_ns::create_parser(&local_1f8,&local_150);
      local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_258,0xffff);
      iVar8 = 0;
      do {
        first = local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
        sVar5 = fread(local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,1,
                      (long)local_258.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_258.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,__stream);
        if ((sVar5 < (ulong)((long)local_258.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_258.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) &&
           (iVar4 = ferror(__stream), iVar4 != 0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"error: there was an error reading input",0x27);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
          std::ostream::put('\0');
          std::ostream::flush();
LAB_0010e596:
          iVar8 = 1;
LAB_0010e59c:
          bVar2 = false;
        }
        else {
          pstore::json::parser<pstore::exchange::import_ns::callbacks>::input<char*>
                    (&local_1f8,(char *)first,(char *)(first + sVar5));
          if (local_1f8.error_._M_value != 0) {
            (anonymous_namespace)::input_name_abi_cxx11_();
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_218,local_210);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
            (**(code **)(*(long *)local_1f8.error_._M_cat + 0x20))
                      (&local_238,local_1f8.error_._M_cat,local_1f8.error_._M_value);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(char *)local_238,local_230);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            if (local_238 != local_228) {
              operator_delete(local_238,local_228[0] + 1);
            }
            if (local_218 != local_208) {
              operator_delete(local_218,local_208[0] + 1);
            }
            goto LAB_0010e596;
          }
          iVar4 = feof(__stream);
          if (iVar4 != 0) {
            pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(&local_1f8);
            goto LAB_0010e59c;
          }
          bVar2 = true;
        }
      } while (bVar2);
      if (local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_258.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_258.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.string_._M_dataplus._M_p != &local_1f8.string_.field_2) {
        operator_delete(local_1f8.string_._M_dataplus._M_p,
                        local_1f8.string_.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8.callbacks_.context_.
          super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f8.callbacks_.context_.
                   super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::
      deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
      ::~deque(&local_1f8.stack_.c);
      if ((_Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
           )local_1f8.singletons_._M_t.
            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
            .
            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
            ._M_head_impl !=
          (_Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
           )0x0) {
        operator_delete((void *)local_1f8.singletons_._M_t.
                                super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                                .
                                super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                                ._M_head_impl,0x68);
      }
    }
    if ((__stream != (FILE *)0x0) && (_stdin != __stream)) {
      fclose(__stream);
    }
    pstore::database::~database(&local_150);
  }
  return iVar8;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;
    PSTORE_TRY {
        parse_command_line_options (argc, argv, "pstore import utility\n");

        if (pstore::file::exists (db_path.get ())) {
            error_stream << PSTORE_NATIVE_TEXT (
                                "error: the import database must not be an existing file.")
                         << std::endl;
            return EXIT_FAILURE;
        }

        pstore::database db{db_path.get (), pstore::database::access_mode::writable};

        auto const close = [] (FILE * const file) {
            if (file != stdin) {
                std::fclose (file);
            }
        };
        std::unique_ptr<FILE, decltype (close)> infile{open_input (), close};
        if (infile.get () == nullptr) {
            auto const err = errno;
            error_stream << PSTORE_NATIVE_TEXT (R"(error: could not open ")")
                         << pstore::utf::to_native_string (input_name ()) << R"(": )"
                         << std::strerror (err) << std::endl;
            return EXIT_FAILURE;
        }

        auto parser = pstore::exchange::import_ns::create_parser (db);

        std::vector<std::uint8_t> buffer;
        buffer.resize (65535);

        for (;;) {
            auto * const ptr = reinterpret_cast<char *> (buffer.data ());
            std::size_t const nread =
                std::fread (ptr, sizeof (std::uint8_t), buffer.size (), infile.get ());
            if (nread < buffer.size ()) {
                if (std::ferror (infile.get ())) {
                    error_stream << PSTORE_NATIVE_TEXT ("error: there was an error reading input")
                                 << std::endl;
                    exit_code = EXIT_FAILURE;
                    break;
                }
            }

            parser.input (ptr, ptr + nread);
            if (parser.has_error ()) {
                auto const coord = parser.coordinate ();
                error_stream << pstore::utf::to_native_string (input_name ())
                             << PSTORE_NATIVE_TEXT (":") << coord.row << PSTORE_NATIVE_TEXT (":")
                             << coord.column << PSTORE_NATIVE_TEXT (": error: ")
                             << pstore::utf::to_native_string (parser.last_error ().message ())
                             << std::endl;
                exit_code = EXIT_FAILURE;
                break;
            }

            // Stop if we've reached the end of the file.
            if (std::feof (infile.get ())) {
                parser.eof ();
                break;
            }
        }
    }